

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

void __thiscall
EDLines::SplitSegment2Lines(EDLines *this,double *x,double *y,int noPixels,int segmentNo)

{
  pointer *ppLVar1;
  uint uVar2;
  EDLines *pEVar3;
  int iVar4;
  long lVar5;
  uint count;
  ulong uVar6;
  long lVar7;
  int iVar8;
  LineSegment *pLVar9;
  iterator __position;
  int iVar10;
  int iVar11;
  byte bVar12;
  double dVar13;
  double dVar14;
  double a;
  double b;
  double dVar15;
  int lastInvert;
  double lastA;
  double lastB;
  double error;
  double local_120;
  double local_110;
  long local_f8;
  ulong local_f0;
  int local_e4;
  ulong local_e0;
  double local_d8;
  ulong local_d0;
  double local_c8;
  double local_c0;
  int local_b4;
  EDLines *local_b0;
  long local_a8;
  vector<LineSegment,_std::allocator<LineSegment>_> *local_a0;
  ulong local_98;
  double local_90;
  double local_88;
  double local_80;
  LineSegment local_78;
  
  bVar12 = 0;
  iVar4 = this->min_line_len;
  if (iVar4 <= noPixels) {
    local_a0 = &this->lines;
    local_d0 = 0;
    local_b4 = segmentNo;
    do {
      local_f8 = 0;
      while (LineFit(x,y,iVar4,&local_d8,&local_c0,&local_80,&local_e4), iVar4 = local_e4,
            0.5 < local_80) {
        x = x + 1;
        y = y + 1;
        iVar4 = this->min_line_len;
        local_f8 = local_f8 + -1;
        if ((int)local_f8 + noPixels + 1 <= iVar4) {
          return;
        }
      }
      uVar6 = (ulong)(uint)this->min_line_len;
      local_c8 = this->line_error;
      uVar2 = (uint)local_f8;
      local_e0 = uVar6;
      local_b0 = this;
      local_98 = (ulong)(uint)noPixels;
      do {
        b = local_c0;
        a = local_d8;
        iVar11 = (int)uVar6;
        if ((int)(noPixels + uVar2) <= iVar11) goto LAB_00116f9b;
        local_f0 = (ulong)(iVar11 - 1);
        uVar6 = (ulong)iVar11;
        iVar8 = 0;
        iVar10 = 0;
        do {
          dVar13 = ComputeMinDistance(x[uVar6],y[uVar6],a,b,iVar4);
          if (dVar13 <= local_c8) {
            iVar10 = iVar10 + 1;
            iVar8 = 0;
            local_f0 = uVar6 & 0xffffffff;
          }
          else {
            if (3 < iVar8) break;
            iVar8 = iVar8 + 1;
          }
          uVar6 = uVar6 + 1;
        } while ((long)uVar6 < noPixels + local_f8);
        if (iVar10 < 2) break;
        count = ((int)local_e0 - iVar11) + (int)local_f0 + 1;
        local_e0 = (ulong)count;
        LineFit(x,y,count,&local_d8,&local_c0,iVar4);
        uVar6 = (ulong)((int)local_f0 + 1U);
        a = local_d8;
        b = local_c0;
      } while ((int)((int)local_f0 + 1U) < (int)(noPixels + uVar2));
      lVar7 = 0;
      do {
        lVar5 = lVar7;
        dVar13 = x[lVar5];
        dVar15 = y[lVar5];
        dVar14 = ComputeMinDistance(dVar13,dVar15,a,b,iVar4);
        lVar7 = lVar5 + 1;
      } while (local_c8 < dVar14);
      if (iVar4 == 0) {
        if ((b != 0.0) || (local_120 = a, local_110 = dVar13, NAN(b))) {
          local_110 = (a - (dVar15 - dVar13 * (-1.0 / b))) / (-1.0 / b - b);
          local_120 = b * local_110 + a;
        }
      }
      else if ((b != 0.0) || (local_120 = dVar15, local_110 = a, NAN(b))) {
        local_120 = (a - (dVar13 - dVar15 * (-1.0 / b))) / (-1.0 / b - b);
        local_110 = b * local_120 + a;
      }
      lVar7 = (long)(int)local_f0;
      uVar6 = (ulong)((int)local_f0 + 2U);
      iVar11 = ((int)local_f0 + 2U) - (int)lVar5;
      local_a8 = lVar5 + 1;
      do {
        local_88 = x[lVar7];
        local_90 = y[lVar7];
        dVar13 = ComputeMinDistance(local_88,local_90,a,b,iVar4);
        pEVar3 = local_b0;
        lVar7 = lVar7 + -1;
        iVar11 = iVar11 + -1;
        uVar6 = (ulong)((int)uVar6 - 1);
      } while (local_c8 < dVar13);
      if (iVar4 == 0) {
        if ((b != 0.0) || (dVar13 = a, dVar15 = local_88, NAN(b))) {
          dVar15 = (a - (local_90 - local_88 * (-1.0 / b))) / (-1.0 / b - b);
          dVar13 = b * dVar15 + a;
        }
      }
      else if ((b != 0.0) || (dVar13 = local_90, dVar15 = a, NAN(b))) {
        dVar13 = (a - (local_88 - local_90 * (-1.0 / b))) / (-1.0 / b - b);
        dVar15 = b * dVar13 + a;
      }
      if ((local_120 != dVar13) || (NAN(local_120) || NAN(dVar13))) {
LAB_00116ed8:
        local_78.a = a;
        local_78.b = b;
        local_78.invert = iVar4;
        local_78.sx = local_110;
        local_78.sy = local_120;
        local_78.ex = dVar15;
        local_78.ey = dVar13;
        local_78.segmentNo = local_b4;
        local_78.firstPixelIndex = (int)local_a8 + (int)local_d0 + ~uVar2;
        local_78.len = iVar11;
        __position._M_current =
             (local_b0->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (local_b0->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<LineSegment,_std::allocator<LineSegment>_>::_M_realloc_insert<LineSegment>
                    (local_a0,__position,&local_78);
        }
        else {
          pLVar9 = &local_78;
          for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
            (__position._M_current)->a = pLVar9->a;
            pLVar9 = (LineSegment *)((long)pLVar9 + ((ulong)bVar12 * -2 + 1) * 8);
            __position._M_current = __position._M_current + (ulong)bVar12 * -0x10 + 8;
          }
          ppLVar1 = &(local_b0->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
        }
        pEVar3->linesNo = pEVar3->linesNo + 1;
        local_e0 = uVar6;
      }
      else if ((local_110 != dVar15) || (NAN(local_110) || NAN(dVar15))) goto LAB_00116ed8;
LAB_00116f9b:
      iVar4 = (int)local_e0;
      noPixels = ((int)local_98 - iVar4) + uVar2;
      x = x + iVar4;
      y = y + iVar4;
      local_d0 = (ulong)((iVar4 + (int)local_d0) - uVar2);
      iVar4 = local_b0->min_line_len;
      this = local_b0;
    } while (iVar4 <= noPixels);
  }
  return;
}

Assistant:

void EDLines::SplitSegment2Lines(double * x, double * y, int noPixels, int segmentNo)
{

	// First pixel of the line segment within the segment of points
	int firstPixelIndex = 0;

	while (noPixels >= min_line_len) {
		// Start by fitting a line to MIN_LINE_LEN pixels
		bool valid = false;
		double lastA, lastB, error;
		int lastInvert;

		while (noPixels >= min_line_len) {
			LineFit(x, y, min_line_len, lastA, lastB, error, lastInvert);
			if (error <= 0.5) { valid = true; break; }

#if 1
			noPixels -= 1;   // Go slowly
			x += 1; y += 1;
			firstPixelIndex += 1;
#else
			noPixels -= 2;   // Go faster (for speed)
			x += 2; y += 2;
			firstPixelIndex += 2;
#endif
		} //end-while

		if (valid == false) return;

		// Now try to extend this line
		int index = min_line_len;
		int len = min_line_len;

		while (index < noPixels) {
			int startIndex = index;
			int lastGoodIndex = index - 1;
			int goodPixelCount = 0;
			int badPixelCount = 0;
			while (index < noPixels) {
				double d = ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert);

				if (d <= line_error) {
					lastGoodIndex = index;
					goodPixelCount++;
					badPixelCount = 0;

				}
				else {
					badPixelCount++;
					if (badPixelCount >= 5) break;
				} //end-if

				index++;
			} //end-while

			if (goodPixelCount >= 2) {
				len += lastGoodIndex - startIndex + 1;
				LineFit(x, y, len, lastA, lastB, lastInvert);  // faster LineFit
				index = lastGoodIndex + 1;
			} // end-if

			if (goodPixelCount < 2 || index >= noPixels) {
				// End of a line segment. Compute the end points
				double sx, sy, ex, ey;

				int index = 0;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index++;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, sx, sy);
				int noSkippedPixels = index;

				index = lastGoodIndex;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index--;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, ex, ey);

				if ((sx == ex) & (sy == ey))
					break;

				// Add the line segment to lines
				lines.push_back(LineSegment(lastA, lastB, lastInvert, sx, sy, ex, ey, segmentNo, firstPixelIndex + noSkippedPixels, index - noSkippedPixels + 1));
				linesNo++;
				len = index + 1;
				break;
			} //end-else
		} //end-while

		noPixels -= len;
		x += len;
		y += len;
		firstPixelIndex += len;
	} //end-while
}